

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

bool __thiscall
wasm::OptimizeInstructions::shouldCanonicalize(OptimizeInstructions *this,Binary *binary)

{
  Id IVar1;
  BinaryOp BVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  
  BVar2 = binary->op;
  uVar6 = (ulong)BVar2;
  bVar4 = true;
  if (uVar6 < 0x3b) {
    if ((0x78003070a018385U >> (uVar6 & 0x3f) & 1) != 0) {
      return true;
    }
    if ((0x4000002UL >> (uVar6 & 0x3f) & 1) != 0) {
      if ((binary->right->_id == ConstId) && (binary->left->_id != ConstId)) {
        return true;
      }
      if ((BVar2 - MulInt32 < 0x18) && ((0x8060e1U >> (BVar2 - MulInt32 & 0x1f) & 1) != 0)) {
        return true;
      }
      goto LAB_009d6505;
    }
  }
  if (BVar2 - MinFloat64 < 4) {
    return true;
  }
LAB_009d6505:
  bVar3 = Binary::isRelational(binary);
  if (!bVar3) {
    bVar4 = false;
    uVar5 = binary->op - AddFloat32;
    if (uVar5 < 0x10) {
      if ((0xa005U >> (uVar5 & 0x1f) & 1) == 0) {
        if ((0x4002U >> (uVar5 & 0x1f) & 1) != 0) {
          bVar4 = binary->right->_id == ConstId;
        }
      }
      else {
        IVar1 = binary->left->_id;
        if (IVar1 == ConstId) {
          bVar4 = Literal::isNaN((Literal *)(binary->left + 1));
          uVar5 = (uint)!bVar4;
        }
        bVar4 = (bool)(IVar1 == ConstId & (byte)uVar5);
      }
    }
  }
  return bVar4;
}

Assistant:

bool shouldCanonicalize(Binary* binary) {
    if ((binary->op == SubInt32 || binary->op == SubInt64) &&
        binary->right->is<Const>() && !binary->left->is<Const>()) {
      return true;
    }
    if (Properties::isSymmetric(binary) || binary->isRelational()) {
      return true;
    }
    switch (binary->op) {
      case SubFloat32:
      case SubFloat64: {
        // Should apply  x - C  ->  x + (-C)
        return binary->right->is<Const>();
      }
      case AddFloat32:
      case MulFloat32:
      case AddFloat64:
      case MulFloat64: {
        // If the LHS is known to be non-NaN, the operands can commute.
        // We don't care about the RHS because right now we only know if
        // an expression is non-NaN if it is constant, but if the RHS is
        // constant, then this expression is already canonicalized.
        if (auto* c = binary->left->dynCast<Const>()) {
          return !c->value.isNaN();
        }
        return false;
      }
      default:
        return false;
    }
  }